

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O1

void predicate_suite::test_none_of(void)

{
  bool bVar1;
  reference piVar2;
  reference piVar3;
  circular_view<int,_18446744073709551615UL> *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  initializer_list<int> input;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<int> local_98;
  basic_iterator<int> local_88;
  basic_iterator<int> local_78;
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_50.member.data = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_88.parent = (view_pointer)0x160000000b;
  local_88.current = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input);
  uVar6 = local_50.member.cap * 2;
  uVar5 = uVar6 - (local_50.member.cap & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    local_98.current = uVar6 - 1 & local_50.member.next - local_50.member.size;
  }
  else {
    local_98.current = (local_50.member.next - local_50.member.size) % uVar6;
  }
  if ((byte)(uVar5 >> 0x38) < 2) {
    uVar6 = uVar6 - 1 & local_50.member.next;
  }
  else {
    uVar6 = local_50.member.next % uVar6;
  }
  lVar7 = (long)(uVar6 - local_98.current) >> 2;
  local_98.parent = &local_50;
  local_78.parent = &local_50;
  local_78.current = uVar6;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 == 0xb) goto LAB_00105c6a;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 == 0xb) goto LAB_00105c6a;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 == 0xb) goto LAB_00105c6a;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 == 0xb) goto LAB_00105c6a;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = uVar6 - local_98.current;
  if (lVar7 == 1) {
LAB_00105c28:
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar2 != 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      pcVar4 = &local_50;
      uVar5 = uVar6;
    }
  }
  else if (lVar7 == 2) {
LAB_00105c0a:
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar2 != 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      goto LAB_00105c28;
    }
  }
  else {
    pcVar4 = &local_50;
    uVar5 = uVar6;
    if (lVar7 == 3) {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 != 0xb) {
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  (&local_98);
        goto LAB_00105c0a;
      }
    }
  }
LAB_00105c6a:
  local_88.parent = pcVar4;
  local_88.current = uVar5;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1bb,"void predicate_suite::test_none_of()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
  *piVar3 = 0x37;
  uVar6 = local_50.member.cap * 2;
  uVar5 = uVar6 - (local_50.member.cap & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    local_98.current = uVar6 - 1 & local_50.member.next - local_50.member.size;
  }
  else {
    local_98.current = (local_50.member.next - local_50.member.size) % uVar6;
  }
  if ((byte)(uVar5 >> 0x38) < 2) {
    uVar6 = uVar6 - 1 & local_50.member.next;
  }
  else {
    uVar6 = local_50.member.next % uVar6;
  }
  lVar7 = (long)(uVar6 - local_98.current) >> 2;
  local_98.parent = &local_50;
  local_78.parent = &local_50;
  local_78.current = uVar6;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 == 0xb) goto LAB_00105e81;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 == 0xb) goto LAB_00105e81;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 == 0xb) goto LAB_00105e81;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 == 0xb) goto LAB_00105e81;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = uVar6 - local_98.current;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pcVar4 = &local_50;
      uVar5 = uVar6;
      if (lVar7 != 3) goto LAB_00105e81;
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar2 == 0xb) goto LAB_00105e81;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    }
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar2 == 0xb) goto LAB_00105e81;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
  }
  local_88.parent = local_98.parent;
  local_88.current = local_98.current;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_88);
  pcVar4 = local_98.parent;
  uVar5 = local_98.current;
  if (*piVar2 != 0xb) {
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    pcVar4 = &local_50;
    uVar5 = uVar6;
  }
LAB_00105e81:
  local_88.parent = pcVar4;
  local_88.current = uVar5;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1bd,"void predicate_suite::test_none_of()",bVar1);
  return;
}

Assistant:

void test_none_of()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    BOOST_TEST(!std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    BOOST_TEST(std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
}